

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O2

bool EV_Teleport(int tid,int tag,line_t *line,int side,AActor *thing,int flags)

{
  APlayerPawn *pAVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  AActor *pAVar9;
  PClass *base;
  int iVar10;
  byte bVar11;
  int tag_00;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  double dVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double local_d8;
  double local_b8;
  double local_a8;
  NActorIterator it2;
  NActorIterator iterator;
  DAngle local_60;
  FActorIterator it3;
  DVector3 local_48;
  
  if (thing != (AActor *)0x0) {
    if (thing->player == (player_t *)0x0) {
      bVar11 = 0;
    }
    else {
      bVar11 = (*(byte *)((long)&thing->player->cheats + 1) & 0x20) >> 5;
    }
    uVar12 = 0;
    if (((thing->flags2).Value & 0x80) != 0 || side != 0) goto LAB_004dea07;
    if (((byte)ib_compatflags & 8) == 0) {
      uVar12 = (ulong)(uint)tag;
    }
    tag_00 = (int)uVar12;
    if (tid == 0) {
      if (tag_00 != 0) {
        it2.super_FActorIterator.base =
             (AActor *)CONCAT44(tagManager.TagHashFirst[uVar12 & 0xff],tag_00);
        while (uVar7 = FSectorTagIterator::Next((FSectorTagIterator *)&it2), -1 < (int)uVar7) {
          TThinkerIterator<AActor>::TThinkerIterator
                    ((TThinkerIterator<AActor> *)&iterator,NAME_TeleportDest,0x80);
          while (pAVar9 = (AActor *)FThinkerIterator::Next((FThinkerIterator *)&iterator),
                pAVar9 != (AActor *)0x0) {
            if (pAVar9->Sector == sectors + uVar7) goto LAB_004de71f;
          }
        }
      }
      goto LAB_004dea04;
    }
    iterator.super_FActorIterator.base = (AActor *)0x0;
    iterator.super_FActorIterator.id = tid;
    it2.super_FActorIterator.base = (AActor *)CONCAT44(it2.super_FActorIterator.base._4_4_,0x77);
    iterator.type = PClass::FindClass((FName *)&it2);
    iVar10 = 0;
    while (pAVar9 = NActorIterator::Next(&iterator), pAVar9 != (AActor *)0x0) {
      if ((tag_00 == 0) ||
         (bVar5 = FTagManager::SectorHasTag(&tagManager,pAVar9->Sector,tag_00), bVar5)) {
        iVar10 = iVar10 + 1;
      }
    }
    if (iVar10 == 1) {
LAB_004de8a1:
      pAVar9 = (AActor *)0x0;
      while (0 < iVar10) {
        pAVar9 = NActorIterator::Next(&iterator);
        if ((tag_00 == 0) ||
           (bVar5 = FTagManager::SectorHasTag(&tagManager,pAVar9->Sector,tag_00), bVar5)) {
          iVar10 = iVar10 + -1;
        }
      }
    }
    else {
      if (iVar10 != 0) {
        if (bVar11 == 0) {
          iVar8 = FRandom::operator()(&pr_teleport);
          iVar10 = iVar8 % iVar10 + 1;
        }
        goto LAB_004de8a1;
      }
      if (tag_00 != 0) goto LAB_004dea04;
      it2.super_FActorIterator.base = (AActor *)0x0;
      it3.base = (AActor *)CONCAT44(it3.base._4_4_,0x104);
      it2.super_FActorIterator.id = tid;
      it2.type = PClass::FindClass((FName *)&it3);
      pAVar9 = NActorIterator::Next(&it2);
      if (pAVar9 == (AActor *)0x0) {
        it3.base = (AActor *)0x0;
        it3.id = tid;
        do {
          pAVar9 = FActorIterator::Next(&it3);
          if (pAVar9 == (AActor *)0x0) break;
        } while (((pAVar9->flags).Value & 2) != 0);
      }
    }
    if (pAVar9 != (AActor *)0x0) {
LAB_004de71f:
      bVar5 = (flags & 0x60U) == 0;
      if (line == (line_t *)0x0 || bVar5) {
        base = PClass::FindClass(NAME_TeleportDest2);
        bVar6 = DObject::IsKindOf((DObject *)pAVar9,base);
        uVar17 = 0;
        uVar18 = 0;
        uVar19 = 0;
        uVar20 = 0;
        local_d8 = 0.0;
        dVar15 = local_d8;
        local_d8 = 0.0;
        if (bVar6) {
          local_a8 = 0.0;
          local_b8 = 0.0;
          local_d8 = dVar15;
          goto LAB_004de87e;
        }
        uVar13 = 0;
        uVar14 = 0xc1e00000;
        local_a8 = 0.0;
        local_b8 = 0.0;
      }
      else {
        iterator.super_FActorIterator.base = (AActor *)(line->delta).X;
        iterator.super_FActorIterator._8_8_ = (line->delta).Y;
        TVector2<double>::Angle((TVector2<double> *)&it2);
        local_d8 = ((double)it2.super_FActorIterator.base - (pAVar9->Angles).Yaw.Degrees) + 90.0;
        if ((flags & 0x40U) != 0) {
          local_d8 = (double)((ulong)local_d8 ^ (ulong)DAT_00668250);
        }
        local_a8 = fastsindeg(local_d8);
        local_b8 = fastcosdeg(local_d8);
        uVar17 = *(undefined4 *)&(thing->Vel).X;
        uVar18 = *(undefined4 *)((long)&(thing->Vel).X + 4);
        uVar19 = *(undefined4 *)&(thing->Vel).Y;
        uVar20 = *(undefined4 *)((long)&(thing->Vel).Y + 4);
LAB_004de87e:
        dVar15 = (pAVar9->__Pos).Z;
        uVar13 = SUB84(dVar15,0);
        uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
      }
      dVar15 = 0.0;
      if ((((byte)i_compatflags2 & 1) != 0) && (thing->player != (player_t *)0x0)) {
        dVar15 = 0.01;
      }
      local_48.X = (pAVar9->__Pos).X;
      local_48.Y = (pAVar9->__Pos).Y;
      local_48.Z = (double)CONCAT44(uVar14,uVar13);
      local_60.Degrees = dVar15 + (pAVar9->Angles).Yaw.Degrees;
      bVar6 = P_Teleport(thing,&local_48,&local_60,flags);
      if (bVar6) {
        dVar15 = (double)CONCAT44(uVar18,uVar17);
        dVar4 = (double)CONCAT44(uVar20,uVar19);
        if (line != (line_t *)0x0 && !bVar5) {
          (thing->Angles).Yaw.Degrees = local_d8 + (thing->Angles).Yaw.Degrees;
          dVar16 = local_b8 * dVar15 - dVar4 * local_a8;
          dVar3 = dVar15 * local_a8 + local_b8 * dVar4;
          auVar2._8_4_ = SUB84(dVar3,0);
          auVar2._0_8_ = dVar16;
          auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
          (thing->Vel).X = dVar16;
          (thing->Vel).Y = (double)auVar2._8_8_;
        }
        uVar12 = 1;
        if ((((dVar15 == 0.0) && (!NAN(dVar15))) && (dVar4 == 0.0)) &&
           (((!NAN(dVar4) && (thing->player != (player_t *)0x0)) &&
            (pAVar1 = thing->player->mo, pAVar1 == (APlayerPawn *)thing && bVar11 == 0)))) {
          (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x25])();
        }
        goto LAB_004dea07;
      }
    }
  }
LAB_004dea04:
  uVar12 = 0;
LAB_004dea07:
  return SUB81(uVar12,0);
}

Assistant:

bool EV_Teleport (int tid, int tag, line_t *line, int side, AActor *thing, int flags)
{
	AActor *searcher;
	double z;
	DAngle angle = 0.;
	double s = 0, c = 0;
	double vx = 0, vy = 0;
	DAngle badangle = 0.;

	if (thing == NULL)
	{ // Teleport function called with an invalid actor
		return false;
	}
	bool predicting = (thing->player && (thing->player->cheats & CF_PREDICTING));
	if (thing->flags2 & MF2_NOTELEPORT)
	{
		return false;
	}
	if (side != 0)
	{ // Don't teleport if hit back of line, so you can get out of teleporter.
		return 0;
	}
	searcher = SelectTeleDest(tid, tag, predicting);
	if (searcher == NULL)
	{
		return false;
	}
	// [RH] Lee Killough's changes for silent teleporters from BOOM
	if ((flags & (TELF_ROTATEBOOM|TELF_ROTATEBOOMINVERSE)) && line)
	{
		// Get the angle between the exit thing and source linedef.
		// Rotate 90 degrees, so that walking perpendicularly across
		// teleporter linedef causes thing to exit in the direction
		// indicated by the exit thing.
		angle = line->Delta().Angle() - searcher->Angles.Yaw + 90.;
		if (flags & TELF_ROTATEBOOMINVERSE) angle = -angle;

		// Sine, cosine of angle adjustment
		s = angle.Sin();
		c = angle.Cos();

		// Velocity of thing crossing teleporter linedef
		vx = thing->Vel.X;
		vy = thing->Vel.Y;

		z = searcher->Z();
	}
	else if (searcher->IsKindOf (PClass::FindClass(NAME_TeleportDest2)))
	{
		z = searcher->Z();
	}
	else
	{
		z = ONFLOORZ;
	}
	if ((i_compatflags2 & COMPATF2_BADANGLES) && (thing->player != NULL))
	{
		badangle = 0.01;
	}
	if (P_Teleport (thing, DVector3(searcher->Pos(), z), searcher->Angles.Yaw + badangle, flags))
	{
		// [RH] Lee Killough's changes for silent teleporters from BOOM
		if (line)
		{
			if (flags & (TELF_ROTATEBOOM| TELF_ROTATEBOOMINVERSE))
			{
				// Rotate thing according to difference in angles (or not - Boom got the direction wrong here.)
				thing->Angles.Yaw += angle;

				// Rotate thing's velocity to come out of exit just like it entered
				thing->Vel.X = vx*c - vy*s;
				thing->Vel.Y = vy*c + vx*s;
			}
		}
		if (vx == 0 && vy == 0 && thing->player != NULL && thing->player->mo == thing && !predicting)
		{
			thing->player->mo->PlayIdle ();
		}
		return true;
	}
	return false;
}